

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>
                   (appender out,unsigned_long value,uint prefix,format_specs<char> *specs,
                   digit_grouping<char> *grouping)

{
  type tVar1;
  int value_00;
  type tVar2;
  uint local_35c;
  anon_class_24_3_e2c60416 local_2f8;
  unsigned_long local_2e0;
  uint local_2d8;
  undefined4 local_2d4;
  uint size;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_2c8;
  appender local_2c0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_2b8;
  appender local_2b0;
  undefined1 local_2a1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bStack_2a0;
  bool upper_1;
  appender local_298;
  byte local_289;
  undefined1 auStack_288 [7];
  bool upper;
  appender local_280;
  appender local_278 [3];
  allocator<char> local_259;
  undefined1 local_258 [8];
  memory_buffer buffer;
  int num_digits;
  digit_grouping<char> *grouping_local;
  format_specs<char> *specs_local;
  char cStack_20;
  uint prefix_local;
  unsigned_long value_local;
  appender out_local;
  
  buffer.alloc_ = (allocator<char>)0x0;
  buffer._533_3_ = 0;
  specs_local._4_4_ = prefix;
  _cStack_20 = value;
  value_local = (unsigned_long)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_258,&local_259);
  std::allocator<char>::~allocator(&local_259);
  switch(specs->type) {
  case none:
  case dec:
    buffer._532_4_ = count_digits(_cStack_20);
    appender::back_insert_iterator(local_278,(buffer<char> *)local_258);
    _auStack_288 = format_decimal<char,_unsigned_long,_fmt::v10::appender,_0>
                             (local_278[0],_cStack_20,buffer._532_4_);
    break;
  case oct:
    buffer._532_4_ = count_digits<3,unsigned_long>(_cStack_20);
    if ((((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) && (specs->precision <= (int)buffer._532_4_)
        ) && (_cStack_20 != 0)) {
      prefix_append((uint *)((long)&specs_local + 4),0x30);
    }
    appender::back_insert_iterator(&local_2c0,(buffer<char> *)local_258);
    local_2c8.container =
         (buffer<char> *)
         format_uint<3u,char,fmt::v10::appender,unsigned_long>
                   (local_2c0,_cStack_20,buffer._532_4_,false);
    break;
  case hex_lower:
  case hex_upper:
    local_289 = specs->type == hex_upper;
    if ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) {
      prefix_append((uint *)((long)&specs_local + 4),((byte)~local_289 & 1) << 0xd | 0x5830);
    }
    buffer._532_4_ = count_digits<4,unsigned_long>(_cStack_20);
    appender::back_insert_iterator(&local_298,(buffer<char> *)local_258);
    bStack_2a0.container =
         (buffer<char> *)
         format_uint<4u,char,fmt::v10::appender,unsigned_long>
                   (local_298,_cStack_20,buffer._532_4_,(bool)(local_289 & 1));
    break;
  case bin_lower:
  case bin_upper:
    local_2a1 = specs->type == bin_upper;
    if ((*(ushort *)&specs->field_0x9 >> 7 & 1) != 0) {
      prefix_append((uint *)((long)&specs_local + 4),((byte)~local_2a1 & 1) << 0xd | 0x4230);
    }
    buffer._532_4_ = count_digits<1,unsigned_long>(_cStack_20);
    appender::back_insert_iterator(&local_2b0,(buffer<char> *)local_258);
    local_2b8.container =
         (buffer<char> *)
         format_uint<1u,char,fmt::v10::appender,unsigned_long>
                   (local_2b0,_cStack_20,buffer._532_4_,false);
    break;
  default:
    throw_format_error("invalid format specifier");
  case chr:
    _size = value_local;
    out_local = write_char<char,fmt::v10::appender>((appender)value_local,cStack_20,specs);
    goto LAB_003d1d54;
  }
  if (specs_local._4_4_ == 0) {
    local_35c = 0;
  }
  else {
    local_35c = specs_local._4_4_ >> 0x18;
  }
  tVar1 = to_unsigned<int>(buffer._532_4_);
  value_00 = digit_grouping<char>::count_separators(grouping,buffer._532_4_);
  tVar2 = to_unsigned<int>(value_00);
  local_2d8 = local_35c + tVar1 + tVar2;
  local_2e0 = value_local;
  local_2f8.prefix = (uint *)((long)&specs_local + 4);
  local_2f8.buffer = (memory_buffer *)local_258;
  local_2f8.grouping = grouping;
  out_local = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned_long,char>(fmt::v10::appender,unsigned_long,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                        ((appender)value_local,specs,(ulong)local_2d8,(ulong)local_2d8,&local_2f8);
LAB_003d1d54:
  local_2d4 = 1;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_258);
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}